

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

bool __thiscall optimization::common_expr_del::BlockNodes::exportNode(BlockNodes *this,uint32_t idx)

{
  map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  *this_00;
  size_type sVar1;
  _Base_ptr p_Var2;
  mapped_type_conflict *pmVar3;
  bool bVar4;
  NodeId nodeId;
  set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  parents;
  uint local_68;
  _Rb_tree_color local_64;
  _Rb_tree<optimization::common_expr_del::NodeId,_optimization::common_expr_del::NodeId,_std::_Identity<optimization::common_expr_del::NodeId>,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  local_60;
  
  this_00 = &this->added;
  local_68 = idx;
  sVar1 = std::
          map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
          ::count(this_00,&local_68);
  if (sVar1 == 0) {
    std::
    _Rb_tree<optimization::common_expr_del::NodeId,_optimization::common_expr_del::NodeId,_std::_Identity<optimization::common_expr_del::NodeId>,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
    ::_Rb_tree(&local_60,
               &(((this->nodes).
                  super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_68].
                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->parents)._M_t);
    bVar4 = false;
    for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      local_64 = p_Var2[1]._M_color;
      sVar1 = std::
              map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
              ::count(this_00,&local_64);
      bVar4 = (bool)(bVar4 | sVar1 == 0);
    }
    if (!bVar4) {
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->exportQueue,&local_68);
      pmVar3 = std::
               map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
               ::operator[](this_00,&local_68);
      *pmVar3 = true;
    }
    bVar4 = (bool)(bVar4 ^ 1);
    std::
    _Rb_tree<optimization::common_expr_del::NodeId,_optimization::common_expr_del::NodeId,_std::_Identity<optimization::common_expr_del::NodeId>,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
    ::~_Rb_tree(&local_60);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool exportNode(uint32_t idx) {
    if (added.count(idx)) {
      return false;
    }
    bool flag = false;
    auto parents = nodes[idx]->parents;
    for (auto nodeId : parents) {
      if (!added.count(nodeId.id)) {
        flag = true;
      }
    }
    if (flag) {
      return false;
    }
    exportQueue.push_back(idx);
    added[idx] = true;
    // for (auto operand : nodes[idx]->operands) {
    //   if (operand.index() == 1) {
    //     auto nodeId = std::get<NodeId>(operand);
    //     exportNode(nodeId.id);
    //     break;
    //   }
    // }
    return true;
  }